

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O2

sysbvm_tuple_t sysbvm_integer_printString(sysbvm_context_t *context,sysbvm_tuple_t integer)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  size_t stringSize;
  char buffer [64];
  
  if ((integer & 0xf) != 0) {
    uVar3 = (long)integer >> 4;
    uVar1 = -uVar3;
    if (0 < (long)uVar3) {
      uVar1 = uVar3;
    }
    for (stringSize = 0; stringSize == 0 || uVar1 != 0; stringSize = stringSize + 1) {
      buffer[stringSize] = (byte)(uVar1 % 10) | 0x30;
      uVar1 = uVar1 / 10;
    }
    if ((long)uVar3 < 0) {
      buffer[stringSize] = '-';
      stringSize = stringSize + 1;
    }
    buffer[stringSize] = '\0';
    sVar2 = sysbvm_string_createWithReversedString(context,stringSize,buffer);
    return sVar2;
  }
  sVar2 = sysbvm_string_createWithCString
                    (context,"TODO: sysbvm_integer_printString for large integer.");
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_printString(sysbvm_context_t *context, sysbvm_tuple_t integer)
{
    // Decode the small integer.
    if(sysbvm_tuple_isImmediate(integer))
    {
        sysbvm_stuple_t value = sysbvm_tuple_integer_decodeSmall(integer);
        char buffer[64];
        size_t bufferSize = 0;

        // Work with positive integers.
        bool isNegative = false;
        if(value < 0)
        {
            isNegative = true;
            value = -value;
        }

        // Extract each one of the digits.
        while (value != 0 || bufferSize == 0)
        {
            buffer[bufferSize++] = '0' + (value % 10);
            value /= 10;
        }

        // Add the sign.
        if(isNegative)
            buffer[bufferSize++] = '-';
        buffer[bufferSize] = 0;
        return sysbvm_string_createWithReversedString(context, bufferSize, buffer);
    }

    return sysbvm_string_createWithCString(context, "TODO: sysbvm_integer_printString for large integer.");
}